

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::UninterpretedOption::~UninterpretedOption(UninterpretedOption *this)

{
  ~UninterpretedOption(this);
  operator_delete(this,0x60);
  return;
}

Assistant:

UninterpretedOption::~UninterpretedOption() {
  // @@protoc_insertion_point(destructor:google.protobuf.UninterpretedOption)
  SharedDtor(*this);
}